

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicToricLattice.cpp
# Opt level: O1

int __thiscall
RhombicToricLattice::neighbour(RhombicToricLattice *this,int vertexIndex,string *direction,int sign)

{
  cartesian4 cVar1;
  cartesian4 cVar2;
  int iVar3;
  int iVar4;
  invalid_argument *this_00;
  int iVar5;
  uint uVar6;
  cartesian4 local_30;
  
  if ((sign != -1) && (sign != 1)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Sign must be either 1 or -1.");
LAB_00121432:
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar3 = std::__cxx11::string::compare((char *)direction);
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)direction);
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)direction);
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)direction);
        if (iVar3 != 0) {
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (this_00,"Direction must be one of \'xy\', \'xz\', \'yz\' or \'xyz\'.");
          goto LAB_00121432;
        }
      }
    }
  }
  local_30 = Lattice::indexToCoordinate(&this->super_Lattice,vertexIndex);
  iVar3 = local_30.w;
  iVar4 = std::__cxx11::string::compare((char *)direction);
  iVar5 = sign >> 0x1f;
  if (iVar3 == 1) {
    if (iVar4 == 0) {
      iVar3 = (this->super_Lattice).l;
      local_30.y = (int)((uint)(0 < sign) + local_30.y) % iVar3;
      local_30.x = (int)(local_30.x + (uint)(0 < sign)) % iVar3;
      local_30.z = (local_30.z - iVar5) % iVar3;
      local_30.w = 0;
    }
    iVar3 = std::__cxx11::string::compare((char *)direction);
    cVar1 = local_30;
    if (iVar3 == 0) {
      iVar3 = (this->super_Lattice).l;
      iVar4 = (int)(local_30.x + (uint)(0 < sign)) % iVar3;
      local_30.x = iVar4;
      cVar2 = local_30;
      local_30.z = cVar1.z;
      local_30.w = cVar1.w;
      local_30._0_8_ = cVar2._0_8_;
      local_30.z = (int)((uint)(0 < sign) + local_30.z) % iVar3;
      cVar2 = local_30;
      local_30.y = cVar1.y;
      local_30._8_8_ = cVar2._8_8_;
      local_30.y = (local_30.y - iVar5) % iVar3;
      local_30.w = 0;
    }
    iVar3 = std::__cxx11::string::compare((char *)direction);
    cVar1 = local_30;
    if (iVar3 == 0) {
      iVar3 = (this->super_Lattice).l;
      local_30.y = (int)(local_30.y + (uint)(0 < sign)) % iVar3;
      local_30.z = cVar1.z;
      local_30.w = cVar1.w;
      local_30.z = (int)((uint)(0 < sign) + local_30.z) % iVar3;
      local_30.x = (local_30.x - iVar5) % iVar3;
      local_30.w = 0;
    }
    iVar3 = std::__cxx11::string::compare((char *)direction);
    cVar1 = local_30;
    if (iVar3 != 0) goto LAB_001213e0;
    uVar6 = (uint)(0 < sign);
    iVar3 = (this->super_Lattice).l;
    local_30.y = (int)(local_30.y + uVar6) % iVar3;
    local_30.x = (int)(local_30.x + uVar6) % iVar3;
    local_30.z = cVar1.z;
    local_30.z = (int)(uVar6 + local_30.z) % iVar3;
    local_30.w = 0;
  }
  else {
    if (iVar4 == 0) {
      iVar3 = (this->super_Lattice).l;
      local_30.y = (iVar5 + iVar3 + local_30.y) % iVar3;
      local_30.x = (local_30.x + iVar5 + iVar3) % iVar3;
      local_30.z = (int)((iVar3 - (uint)(0 < sign)) + local_30.z) % iVar3;
      local_30.w = 1;
    }
    iVar3 = std::__cxx11::string::compare((char *)direction);
    cVar1 = local_30;
    if (iVar3 == 0) {
      iVar3 = (this->super_Lattice).l;
      iVar4 = (local_30.x + iVar5 + iVar3) % iVar3;
      local_30.x = iVar4;
      cVar2 = local_30;
      local_30.z = cVar1.z;
      local_30.w = cVar1.w;
      local_30._0_8_ = cVar2._0_8_;
      local_30.z = (iVar5 + iVar3 + local_30.z) % iVar3;
      cVar2 = local_30;
      local_30.y = cVar1.y;
      local_30._8_8_ = cVar2._8_8_;
      local_30.y = (int)((iVar3 - (uint)(0 < sign)) + local_30.y) % iVar3;
      local_30.w = 1;
    }
    iVar3 = std::__cxx11::string::compare((char *)direction);
    cVar1 = local_30;
    if (iVar3 == 0) {
      iVar3 = (this->super_Lattice).l;
      local_30.y = (local_30.y + iVar5 + iVar3) % iVar3;
      local_30.z = cVar1.z;
      local_30.w = cVar1.w;
      local_30.z = (iVar5 + iVar3 + local_30.z) % iVar3;
      local_30.x = (int)((iVar3 - (uint)(0 < sign)) + local_30.x) % iVar3;
      local_30.w = 1;
    }
    iVar3 = std::__cxx11::string::compare((char *)direction);
    cVar1 = local_30;
    if (iVar3 != 0) goto LAB_001213e0;
    iVar3 = (this->super_Lattice).l;
    local_30.y = (local_30.y + iVar5 + iVar3) % iVar3;
    local_30.x = (local_30.x + iVar5 + iVar3) % iVar3;
    local_30.z = cVar1.z;
    local_30.z = (iVar5 + iVar3 + local_30.z) % iVar3;
    local_30.w = 1;
  }
LAB_001213e0:
  iVar3 = Lattice::coordinateToIndex(&this->super_Lattice,&local_30);
  return iVar3;
}

Assistant:

int RhombicToricLattice::neighbour(const int vertexIndex, const std::string &direction, const int sign)
{
    if (!(sign == 1 || sign == -1))
    {
        throw std::invalid_argument("Sign must be either 1 or -1.");
    }
    if (!(direction == "xy" || direction == "xz" || direction == "yz" ||
          direction == "xyz"))
    {
        throw std::invalid_argument("Direction must be one of 'xy', 'xz', 'yz' or 'xyz'.");
    }
    cartesian4 coordinate;
    coordinate = indexToCoordinate(vertexIndex);
    // if (direction == "x")
    //     coordinate.x = (coordinate.x + sign + l) % l;
    // if (direction == "y")
    //     coordinate.y = (coordinate.y + sign + l) % l;
    // if (direction == "z")
    //     coordinate.z = (coordinate.z + sign + l) % l;
    if (coordinate.w == 1)
    {
        if (direction == "xy")
        {
            coordinate.x = (coordinate.x + (sign > 0)) % l;
            coordinate.y = (coordinate.y + (sign > 0)) % l;
            coordinate.z = (coordinate.z + (sign < 0)) % l;
            coordinate.w = 0;
        }
        if (direction == "xz")
        {
            coordinate.x = (coordinate.x + (sign > 0)) % l;
            coordinate.z = (coordinate.z + (sign > 0)) % l;
            coordinate.y = (coordinate.y + (sign < 0)) % l;
            coordinate.w = 0;
        }
        if (direction == "yz")
        {
            coordinate.y = (coordinate.y + (sign > 0)) % l;
            coordinate.z = (coordinate.z + (sign > 0)) % l;
            coordinate.x = (coordinate.x + (sign < 0)) % l;
            coordinate.w = 0;
        }
        if (direction == "xyz")
        {
            coordinate.x = (coordinate.x + (sign > 0)) % l;
            coordinate.y = (coordinate.y + (sign > 0)) % l;
            coordinate.z = (coordinate.z + (sign > 0)) % l;
            coordinate.w = 0;
        }
    }
    else
    {
        if (direction == "xy")
        {
            coordinate.x = (coordinate.x - (sign < 0) + l) % l;
            coordinate.y = (coordinate.y - (sign < 0) + l) % l;
            coordinate.z = (coordinate.z - (sign > 0) + l) % l;
            coordinate.w = 1;
        }
        if (direction == "xz")
        {
            coordinate.x = (coordinate.x - (sign < 0) + l) % l;
            coordinate.z = (coordinate.z - (sign < 0) + l) % l;
            coordinate.y = (coordinate.y - (sign > 0) + l) % l;
            coordinate.w = 1;
        }
        if (direction == "yz")
        {
            coordinate.y = (coordinate.y - (sign < 0) + l) % l;
            coordinate.z = (coordinate.z - (sign < 0) + l) % l;
            coordinate.x = (coordinate.x - (sign > 0) + l) % l;
            coordinate.w = 1;
        }
        if (direction == "xyz")
        {
            coordinate.x = (coordinate.x - (sign < 0) + l) % l;
            coordinate.y = (coordinate.y - (sign < 0) + l) % l;
            coordinate.z = (coordinate.z - (sign < 0) + l) % l;
            coordinate.w = 1;
        }
    }
    return coordinateToIndex(coordinate);
}